

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_initCDict_internal
                 (ZSTD_CDict *cdict,void *dictBuffer,size_t dictSize,
                 ZSTD_dictLoadMethod_e dictLoadMethod,ZSTD_dictContentType_e dictContentType,
                 ZSTD_compressionParameters cParams)

{
  uint uVar1;
  void *__dest;
  size_t dictID;
  ZSTD_CCtx_params params;
  void *end;
  void *internalBuffer;
  ZSTD_dictContentType_e dictContentType_local;
  ZSTD_dictLoadMethod_e dictLoadMethod_local;
  size_t dictSize_local;
  void *dictBuffer_local;
  ZSTD_CDict *cdict_local;
  
  (cdict->matchState).cParams.windowLog = cParams.windowLog;
  (cdict->matchState).cParams.chainLog = cParams.chainLog;
  (cdict->matchState).cParams.hashLog = cParams.hashLog;
  (cdict->matchState).cParams.searchLog = cParams.searchLog;
  (cdict->matchState).cParams.minMatch = cParams.minMatch;
  (cdict->matchState).cParams.targetLength = cParams.targetLength;
  (cdict->matchState).cParams.strategy = cParams.strategy;
  if (((dictLoadMethod == ZSTD_dlm_byRef) || (dictBuffer == (void *)0x0)) || (dictSize == 0)) {
    cdict->dictBuffer = (void *)0x0;
    cdict->dictContent = dictBuffer;
  }
  else {
    __dest = ZSTD_malloc(dictSize,cdict->customMem);
    cdict->dictBuffer = __dest;
    cdict->dictContent = __dest;
    if (__dest == (void *)0x0) {
      return 0xffffffffffffffc0;
    }
    memcpy(__dest,dictBuffer,dictSize);
  }
  cdict->dictContentSize = dictSize;
  ZSTD_reset_compressedBlockState(&cdict->cBlockState);
  params.customMem.opaque =
       ZSTD_reset_matchState
                 (&cdict->matchState,(void *)((long)cdict->workspace + 0x1800),&cParams,
                  ZSTDcrp_continue,0);
  memset(&dictID,0,0x80);
  params.fParams.checksumFlag = 3;
  params.cParams.targetLength = 1;
  dictID._4_4_ = cParams.windowLog;
  unique0x00012004 = cParams.chainLog;
  params.cParams.windowLog = cParams.hashLog;
  params.cParams.chainLog = cParams.searchLog;
  params.cParams.hashLog = cParams.minMatch;
  params.cParams.searchLog = cParams.targetLength;
  params.cParams.minMatch = cParams.strategy;
  cdict_local = (ZSTD_CDict *)
                ZSTD_compress_insertDictionary
                          (&cdict->cBlockState,&cdict->matchState,(ZSTD_CCtx_params *)&dictID,
                           cdict->dictContent,cdict->dictContentSize,dictContentType,ZSTD_dtlm_full,
                           cdict->workspace);
  uVar1 = ERR_isError((size_t)cdict_local);
  if (uVar1 == 0) {
    cdict->dictID = (U32)cdict_local;
    cdict_local = (ZSTD_CDict *)0x0;
  }
  return (size_t)cdict_local;
}

Assistant:

static size_t ZSTD_initCDict_internal(
                    ZSTD_CDict* cdict,
              const void* dictBuffer, size_t dictSize,
                    ZSTD_dictLoadMethod_e dictLoadMethod,
                    ZSTD_dictContentType_e dictContentType,
                    ZSTD_compressionParameters cParams)
{
    DEBUGLOG(3, "ZSTD_initCDict_internal (dictContentType:%u)", (unsigned)dictContentType);
    assert(!ZSTD_checkCParams(cParams));
    cdict->matchState.cParams = cParams;
    if ((dictLoadMethod == ZSTD_dlm_byRef) || (!dictBuffer) || (!dictSize)) {
        cdict->dictBuffer = NULL;
        cdict->dictContent = dictBuffer;
    } else {
        void* const internalBuffer = ZSTD_malloc(dictSize, cdict->customMem);
        cdict->dictBuffer = internalBuffer;
        cdict->dictContent = internalBuffer;
        if (!internalBuffer) return ERROR(memory_allocation);
        memcpy(internalBuffer, dictBuffer, dictSize);
    }
    cdict->dictContentSize = dictSize;

    /* Reset the state to no dictionary */
    ZSTD_reset_compressedBlockState(&cdict->cBlockState);
    {   void* const end = ZSTD_reset_matchState(
                &cdict->matchState,
                (U32*)cdict->workspace + HUF_WORKSPACE_SIZE_U32,
                &cParams, ZSTDcrp_continue, /* forCCtx */ 0);
        assert(end == (char*)cdict->workspace + cdict->workspaceSize);
        (void)end;
    }
    /* (Maybe) load the dictionary
     * Skips loading the dictionary if it is <= 8 bytes.
     */
    {   ZSTD_CCtx_params params;
        memset(&params, 0, sizeof(params));
        params.compressionLevel = ZSTD_CLEVEL_DEFAULT;
        params.fParams.contentSizeFlag = 1;
        params.cParams = cParams;
        {   size_t const dictID = ZSTD_compress_insertDictionary(
                    &cdict->cBlockState, &cdict->matchState, &params,
                    cdict->dictContent, cdict->dictContentSize,
                    dictContentType, ZSTD_dtlm_full, cdict->workspace);
            if (ZSTD_isError(dictID)) return dictID;
            assert(dictID <= (size_t)(U32)-1);
            cdict->dictID = (U32)dictID;
        }
    }

    return 0;
}